

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O3

char * Qiniu_MD5_HexStr_From_Reader(Qiniu_Reader r)

{
  uchar *addr;
  char *pcVar1;
  Qiniu_Digest *self;
  void *data;
  size_t sVar2;
  int i;
  long lVar3;
  undefined2 local_3c [2];
  uchar *local_38;
  
  local_38 = (uchar *)calloc(1,0x10);
  pcVar1 = (char *)malloc(0x21);
  self = Qiniu_Digest_New(QINIU_DIGEST_TYPE_MD5);
  data = malloc(0x400000);
  do {
    sVar2 = (*r.Read)(data,1,0x400000,r.self);
    Qiniu_Digest_Update(self,data,(int)sVar2);
  } while (sVar2 == 0x400000);
  free(data);
  addr = local_38;
  Qiniu_Digest_Final(self,local_38,(size_t *)0x0);
  lVar3 = 0;
  do {
    snprintf((char *)local_3c,3,"%02x",(ulong)addr[lVar3]);
    *(undefined2 *)(pcVar1 + lVar3 * 2) = local_3c[0];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  pcVar1[0x20] = '\0';
  Qiniu_Free(addr);
  return pcVar1;
}

Assistant:

const char *Qiniu_MD5_HexStr_From_Reader(Qiniu_Reader r)
	{

		unsigned char *sign = (unsigned char *)calloc(sizeof(unsigned char), MD5_DIGEST_LENGTH);
		int signLen = MD5_DIGEST_LENGTH * 2 + 1;
		char *signHex = (char *)malloc(sizeof(char) * signLen);
		char temp[3];
		Qiniu_Digest *md5_digest = Qiniu_Digest_New(QINIU_DIGEST_TYPE_MD5);

		{
			size_t unused = 1;
			size_t buffLen = (4 << 20); //read 4M each time
			char *buff = (char *)malloc(sizeof(char) * buffLen);
			size_t n = 0;
			do
			{
				n = r.Read(buff, unused, buffLen, r.self);
				Qiniu_Digest_Update(md5_digest, buff, (int)n);
			} while (n == buffLen);
			free(buff);
		}
		Qiniu_Digest_Final(md5_digest, sign, NULL);
		for (int i = 0; i < MD5_DIGEST_LENGTH; i++)
		{
			Qiniu_snprintf(temp, 3, "%02x", sign[i]);
			temp[2] = '\0';
			memcpy(&(signHex[i * 2]), temp, 2);
		}
		signHex[signLen - 1] = '\0';
		Qiniu_Free(sign);
		return signHex;
	}